

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  char *value;
  string mode;
  string e;
  allocator local_69;
  string local_68;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string
              ((string *)&local_68,"sub-command COMPARE requires a mode to be specified.",
               (allocator *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    return false;
  }
  std::__cxx11::string::string((string *)&local_68,(string *)(pbVar1 + 1));
  bVar2 = std::operator==(&local_68,"EQUAL");
  if ((((bVar2) || (bVar2 = std::operator==(&local_68,"NOTEQUAL"), bVar2)) ||
      (bVar2 = std::operator==(&local_68,"LESS"), bVar2)) ||
     (bVar2 = std::operator==(&local_68,"GREATER"), bVar2)) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x80 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
      __lhs = pbVar1 + 2;
      __rhs = pbVar1 + 3;
      bVar2 = std::operator==(&local_68,"LESS");
      if (bVar2) {
        bVar2 = std::operator<(__lhs,__rhs);
LAB_002cc335:
        if (bVar2 == false) goto LAB_002cc365;
LAB_002cc339:
        value = "1";
      }
      else {
        bVar2 = std::operator==(&local_68,"GREATER");
        if (bVar2) {
          bVar2 = std::operator>(__lhs,__rhs);
          goto LAB_002cc335;
        }
        bVar2 = std::operator==(&local_68,"EQUAL");
        _Var3 = std::operator==(__lhs,__rhs);
        if (bVar2 == _Var3) goto LAB_002cc339;
LAB_002cc365:
        value = "0";
      }
      bVar2 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 4,value);
      goto LAB_002cc37a;
    }
    std::__cxx11::string::string((string *)&local_48,"sub-command COMPARE, mode ",&local_69);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
  }
  else {
    std::operator+(&local_48,"sub-command COMPARE does not recognize mode ",&local_68);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = false;
LAB_002cc37a:
  std::__cxx11::string::~string((string *)&local_68);
  return bVar2;
}

Assistant:

bool cmStringCommand::HandleCompareCommand(std::vector<std::string> const&
                                           args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
    }
  std::string mode = args[1];
  if((mode == "EQUAL") || (mode == "NOTEQUAL") ||
     (mode == "LESS") || (mode == "GREATER"))
    {
    if(args.size() < 5)
      {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
      }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if(mode == "LESS")
      {
      result = (left < right);
      }
    else if(mode == "GREATER")
      {
      result = (left > right);
      }
    else if(mode == "EQUAL")
      {
      result = (left == right);
      }
    else // if(mode == "NOTEQUAL")
      {
      result = !(left == right);
      }
    if(result)
      {
      this->Makefile->AddDefinition(outvar, "1");
      }
    else
      {
      this->Makefile->AddDefinition(outvar, "0");
      }
    return true;
    }
  std::string e = "sub-command COMPARE does not recognize mode "+mode;
  this->SetError(e);
  return false;
}